

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_end(Context *ctx)

{
  RegisterList *pRVar1;
  
  if ((ctx->shader_type == MOJOSHADER_TYPE_PIXEL) && (ctx->major_ver < 2)) {
    pRVar1 = reglist_insert(ctx,&ctx->used_registers,REG_TYPE_COLOROUT,0);
    if (pRVar1 != (RegisterList *)0x0) {
      pRVar1->written = 1;
    }
    output_line(ctx,"MOV oC0, r0;");
  }
  output_line(ctx,"END");
  return;
}

Assistant:

static void emit_ARB1_end(Context *ctx)
{
    // ps_1_* writes color to r0 instead oC0. We move it to the right place.
    // We don't have to worry about a RET opcode messing this up, since
    //  RET isn't available before ps_2_0.
    if (shader_is_pixel(ctx) && !shader_version_atleast(ctx, 2, 0))
    {
        set_used_register(ctx, REG_TYPE_COLOROUT, 0, 1);
        output_line(ctx, "MOV oC0, r0;");
    } // if

    output_line(ctx, "END");
}